

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

string * __thiscall
cmLocalUnixMakefileGenerator3::ConvertToFullPath
          (string *__return_storage_ptr__,cmLocalUnixMakefileGenerator3 *this,string *localPath)

{
  undefined8 in_RAX;
  string *a;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  a = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  uStack_18 = CONCAT17(0x2f,(undefined7)uStack_18);
  cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&>
            (__return_storage_ptr__,a,(char *)((long)&uStack_18 + 7),localPath);
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalUnixMakefileGenerator3::ConvertToFullPath(
  const std::string& localPath)
{
  std::string dir =
    cmStrCat(this->GetCurrentBinaryDirectory(), '/', localPath);
  return dir;
}